

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

Image * GenImageCellular(Image *__return_storage_ptr__,int width,int height,int tileSize)

{
  int iVar1;
  int iVar2;
  undefined1 uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  void *__ptr;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  int j;
  long lVar16;
  float __x;
  double dVar17;
  
  pvVar8 = malloc((long)(height * width) << 2);
  iVar2 = width / tileSize;
  uVar4 = (height / tileSize) * iVar2;
  __ptr = malloc((long)(int)uVar4 * 8);
  uVar9 = 0;
  if ((int)uVar4 < 1) {
    uVar4 = 0;
  }
  for (; uVar4 != uVar9; uVar9 = uVar9 + 1) {
    uVar13 = (ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff;
    iVar5 = GetRandomValue(0,tileSize + -1);
    iVar6 = GetRandomValue(0,tileSize + -1);
    *(float *)((long)__ptr + uVar9 * 8) =
         (float)(iVar6 + (int)((long)uVar13 % (long)iVar2) * tileSize);
    *(float *)((long)__ptr + uVar9 * 8 + 4) =
         (float)(iVar5 + (int)((long)uVar13 / (long)iVar2) * tileSize);
  }
  uVar13 = 0;
  uVar9 = 0;
  if (0 < width) {
    uVar9 = (ulong)(uint)width;
  }
  uVar11 = 0;
  if (0 < height) {
    uVar11 = (ulong)(uint)height;
  }
  for (; uVar13 != uVar11; uVar13 = uVar13 + 1) {
    lVar12 = uVar13 * (long)width;
    iVar5 = (int)((long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff) /
                 (long)tileSize);
    for (uVar15 = 0; uVar15 != uVar9; uVar15 = uVar15 + 1) {
      iVar1 = (int)((long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff) /
                   (long)tileSize);
      iVar14 = (iVar5 + -1) * iVar2 + -1 + iVar1;
      __x = 65536.0;
      for (iVar6 = -1; iVar6 != 2; iVar6 = iVar6 + 1) {
        iVar7 = iVar6 + iVar1;
        if (iVar7 < iVar2 && -1 < iVar7) {
          iVar7 = iVar14;
          for (lVar16 = -1; lVar16 != 2; lVar16 = lVar16 + 1) {
            lVar10 = iVar5 + lVar16;
            if (lVar10 < height / tileSize && -1 < lVar10) {
              dVar17 = hypot((double)((int)uVar15 - (int)*(float *)((long)__ptr + (long)iVar7 * 8)),
                             (double)((int)uVar13 -
                                     (int)*(float *)((long)__ptr + (long)iVar7 * 8 + 4)));
              __x = fminf(__x,(float)dVar17);
            }
            iVar7 = iVar7 + iVar2;
          }
        }
        iVar14 = iVar14 + 1;
      }
      iVar6 = (int)((__x * 256.0) / (float)tileSize);
      uVar3 = (undefined1)iVar6;
      if (0xfe < iVar6) {
        uVar3 = 0xff;
      }
      *(undefined1 *)((long)pvVar8 + uVar15 * 4 + lVar12 * 4) = uVar3;
      *(undefined1 *)((long)pvVar8 + uVar15 * 4 + lVar12 * 4 + 1) = uVar3;
      *(undefined1 *)((long)pvVar8 + uVar15 * 4 + lVar12 * 4 + 2) = uVar3;
      *(undefined1 *)((long)pvVar8 + uVar15 * 4 + lVar12 * 4 + 3) = 0xff;
    }
  }
  free(__ptr);
  __return_storage_ptr__->data = pvVar8;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageCellular(int width, int height, int tileSize)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    int seedsPerRow = width/tileSize;
    int seedsPerCol = height/tileSize;
    int seedCount = seedsPerRow*seedsPerCol;

    Vector2 *seeds = (Vector2 *)RL_MALLOC(seedCount*sizeof(Vector2));

    for (int i = 0; i < seedCount; i++)
    {
        int y = (i/seedsPerRow)*tileSize + GetRandomValue(0, tileSize - 1);
        int x = (i%seedsPerRow)*tileSize + GetRandomValue(0, tileSize - 1);
        seeds[i] = (Vector2){ (float)x, (float)y };
    }

    for (int y = 0; y < height; y++)
    {
        int tileY = y/tileSize;

        for (int x = 0; x < width; x++)
        {
            int tileX = x/tileSize;

            float minDistance = 65536.0f; //(float)strtod("Inf", NULL);

            // Check all adjacent tiles
            for (int i = -1; i < 2; i++)
            {
                if ((tileX + i < 0) || (tileX + i >= seedsPerRow)) continue;

                for (int j = -1; j < 2; j++)
                {
                    if ((tileY + j < 0) || (tileY + j >= seedsPerCol)) continue;

                    Vector2 neighborSeed = seeds[(tileY + j)*seedsPerRow + tileX + i];

                    float dist = (float)hypot(x - (int)neighborSeed.x, y - (int)neighborSeed.y);
                    minDistance = (float)fmin(minDistance, dist);
                }
            }

            // I made this up, but it seems to give good results at all tile sizes
            int intensity = (int)(minDistance*256.0f/tileSize);
            if (intensity > 255) intensity = 255;

            pixels[y*width + x] = (Color){ intensity, intensity, intensity, 255 };
        }
    }

    RL_FREE(seeds);

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}